

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O2

Int __thiscall ipx::ForrestTomlin::_Update(ForrestTomlin *this,double pivot)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  Int IVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer piVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  Int q1;
  int iVar12;
  ulong uVar13;
  pointer pdVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  string local_50;
  
  piVar2 = (this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  uVar13 = uVar6 >> 2;
  iVar12 = (int)uVar13;
  uVar11 = 0;
  uVar8 = 0;
  if (0 < iVar12) {
    uVar8 = uVar13 & 0xffffffff;
  }
  do {
    if (uVar8 == uVar11) {
LAB_00379136:
      piVar7 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)uVar8 == iVar12) {
        pdVar14 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar18 = 0.0;
      }
      else {
        pdVar14 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar18 = pdVar14[uVar8];
      }
      dVar16 = pivot * (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(long)piVar7[(long)this->replace_next_ + 1] + -1];
      piVar3 = (this->R_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = 0;
      dVar17 = 0.0;
      uVar13 = 0;
      do {
        uVar13 = (ulong)(int)uVar13;
        while( true ) {
          if ((iVar12 <= (int)uVar13) ||
             ((int)((ulong)((long)(this->R_).rowidx_queue_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar3) >> 2) <= iVar15)
             ) {
            dVar18 = ABS((dVar16 - (dVar18 - dVar17)) / dVar16);
            iVar15 = (int)((ulong)((long)(this->replaced_).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->replaced_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            if ((long)uVar11 < (long)iVar12) {
              lVar9 = (long)(uVar6 * 0x40000000 + -0x100000000) >> 0x20;
              for (; (long)uVar8 < lVar9; uVar8 = uVar8 + 1) {
                piVar2[uVar8] = piVar2[uVar8 + 1];
                pdVar14[uVar8] = pdVar14[uVar8 + 1];
              }
              piVar2[lVar9] = this->dim_ + iVar15;
              pdVar14[lVar9] = dVar16;
            }
            else {
              SparseMatrix::push_back(&this->U_,this->dim_ + iVar15,dVar16);
              piVar7 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
            iVar12 = piVar7[(long)this->replace_next_ + 1];
            pdVar14 = (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start;
            for (lVar9 = (long)piVar7[this->replace_next_]; lVar9 < (long)iVar12 + -1;
                lVar9 = lVar9 + 1) {
              pdVar14[lVar9] = 0.0;
            }
            (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)iVar12 + -1] = 1.0;
            SparseMatrix::add_column(&this->U_);
            SparseMatrix::add_column(&this->R_);
            std::vector<int,_std::allocator<int>_>::push_back(&this->replaced_,&this->replace_next_)
            ;
            this->replace_next_ = -1;
            this->have_btran_ = false;
            this->have_ftran_ = false;
            if ((dVar16 != 0.0) || (NAN(dVar16))) {
              piVar2 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar16 = 0.0;
              for (lVar9 = (long)piVar2[iVar15]; lVar9 < piVar2[(long)iVar15 + 1]; lVar9 = lVar9 + 1
                  ) {
                dVar17 = ABS((this->R_).values_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar9]);
                if (dVar17 <= dVar16) {
                  dVar17 = dVar16;
                }
                dVar16 = dVar17;
              }
              if (10000000000.0 < dVar16) {
                poVar5 = Control::Debug(this->control_,3);
                pcVar10 = " max eta = ";
                poVar5 = std::operator<<(poVar5," max eta = ");
                sci2_abi_cxx11_(&local_50,(ipx *)pcVar10,dVar16);
                poVar5 = std::operator<<(poVar5,(string *)&local_50);
                std::operator<<(poVar5,'\n');
                std::__cxx11::string::~string((string *)&local_50);
              }
              IVar4 = 0;
              if (1e-08 < dVar18) {
                poVar5 = Control::Debug(this->control_,3);
                pcVar10 = " relative error in new diagonal entry of U = ";
                poVar5 = std::operator<<(poVar5," relative error in new diagonal entry of U = ");
                sci2_abi_cxx11_(&local_50,(ipx *)pcVar10,dVar18);
                poVar5 = std::operator<<(poVar5,(string *)&local_50);
                std::operator<<(poVar5,'\n');
                std::__cxx11::string::~string((string *)&local_50);
                IVar4 = 1;
              }
            }
            else {
              IVar4 = -1;
            }
            return IVar4;
          }
          iVar1 = piVar3[iVar15];
          if (piVar2[uVar13] == iVar1) break;
          if (iVar1 <= piVar2[uVar13]) goto LAB_003791e5;
          uVar13 = uVar13 + 1;
        }
        dVar17 = dVar17 + pdVar14[uVar13] *
                          (this->R_).values_queue_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar15];
        uVar13 = (ulong)((int)uVar13 + 1);
LAB_003791e5:
        iVar15 = iVar15 + 1;
      } while( true );
    }
    if (piVar2[uVar11] == this->replace_next_) {
      uVar8 = uVar11 & 0xffffffff;
      goto LAB_00379136;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

Int ForrestTomlin::_Update(double pivot) {
    Int num_updates = replaced_.size();
    assert(have_ftran_);
    assert(have_btran_);

    // Find the position of the entry with row index replace_next_ in spike.
    // If not present, we will have where == qend.
    assert(replace_next_ >= 0);
    Int qend = U_.queue_size();
    Int where = 0;
    while (where < qend && U_.qindex(where) != replace_next_)
        where++;

    // Compute new diagonal entry of U. newdiag1 will be inserted into U;
    // newdiag2 would be the same in exact arithmetic and is for monitoring
    // numerical stability.
    double olddiag = U_.value(U_.end(replace_next_)-1);
    double newdiag1 = pivot * olddiag;
    double newdiag2 = (where == qend ? 0.0 : U_.qvalue(where)) -
        SparseDot(U_, R_);
    double newdiag_err = std::abs(newdiag1-newdiag2);
    double rel_newdiag_err = newdiag_err / std::abs(newdiag1);

    // Put new diagonal entry at end of spike.
    if (where < qend) {
        for (Int l = where; l < qend-1; l++) {
            U_.qindex(l) = U_.qindex(l+1);
            U_.qvalue(l) = U_.qvalue(l+1);
        }
        U_.qindex(qend-1) = dim_+num_updates;
        U_.qvalue(qend-1) = newdiag1;
    } else {
        U_.push_back(dim_+num_updates, newdiag1);
    }

    // Overwrite replaced column by unit column in U.
    Int end = U_.end(replace_next_);
    for (Int l = U_.begin(replace_next_); l < end-1; l++)
        U_.value(l) = 0.0;
    U_.value(end-1) = 1.0;

    // Finish update.
    U_.add_column();
    R_.add_column();
    replaced_.push_back(replace_next_);
    replace_next_ = -1;
    have_btran_ = false;
    have_ftran_ = false;

    if (newdiag1 == 0.0)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = 0.0;
    for (Int l = R_.begin(num_updates); l < R_.end(num_updates); l++)
        max_eta = std::max(max_eta, std::abs(R_.value(l)));
    if (max_eta > 1e10)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    if (rel_newdiag_err > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(rel_newdiag_err) << '\n';
        return 1;
    }
    return 0;
}